

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shell_renderer.cpp
# Opt level: O3

void __thiscall
duckdb_shell::ModeAsciiRenderer::RenderRow(ModeAsciiRenderer *this,RowResult *result)

{
  pointer ppcVar1;
  ulong uVar2;
  
  ppcVar1 = (result->data).super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  if ((result->data).super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
      super__Vector_impl_data._M_finish != ppcVar1) {
    uVar2 = 0;
    do {
      if (uVar2 != 0) {
        ShellState::Print((this->super_RowRenderer).super_ShellRenderer.state,
                          &(this->super_RowRenderer).super_ShellRenderer.col_sep);
        ppcVar1 = (result->data).super__Vector_base<const_char_*,_std::allocator<const_char_*>_>.
                  _M_impl.super__Vector_impl_data._M_start;
      }
      ShellState::PrintValue((this->super_RowRenderer).super_ShellRenderer.state,ppcVar1[uVar2]);
      uVar2 = uVar2 + 1;
      ppcVar1 = (result->data).super__Vector_base<const_char_*,_std::allocator<const_char_*>_>.
                _M_impl.super__Vector_impl_data._M_start;
    } while (uVar2 < (ulong)((long)(result->data).
                                   super__Vector_base<const_char_*,_std::allocator<const_char_*>_>.
                                   _M_impl.super__Vector_impl_data._M_finish - (long)ppcVar1 >> 3));
  }
  ShellState::Print((this->super_RowRenderer).super_ShellRenderer.state,
                    &(this->super_RowRenderer).super_ShellRenderer.row_sep);
  return;
}

Assistant:

void RenderRow(RowResult &result) override {
		auto &data = result.data;
		for (idx_t i = 0; i < data.size(); i++) {
			if (i > 0) {
				state.Print(col_sep);
			}
			state.PrintValue(data[i]);
		}
		state.Print(row_sep);
	}